

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Btree_MovesComparisonsCopiesSwapsTrackingThreeWayCompare_Test::TestBody
          (Btree_MovesComparisonsCopiesSwapsTrackingThreeWayCompare_Test *this)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  pointer piVar4;
  ulong uVar5;
  int *piVar6;
  pointer piVar7;
  char *pcVar8;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> values;
  SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_100,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
  set100;
  SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_61,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
  set61;
  SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_3,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
  set3;
  InstanceTracker tracker;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertHelper local_b8;
  internal local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  local_88;
  btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
  local_70;
  btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
  local_58;
  InstanceTracker local_40;
  
  local_40.start_instances_ = test_internal::BaseCountedInstance::num_instances_;
  local_40.start_live_instances_ = test_internal::BaseCountedInstance::num_live_instances_;
  local_40.start_moves_ = test_internal::BaseCountedInstance::num_moves_;
  local_40.start_copies_ = test_internal::BaseCountedInstance::num_copies_;
  local_40.start_swaps_ = test_internal::BaseCountedInstance::num_swaps_;
  local_40.start_comparisons_ = test_internal::BaseCountedInstance::num_comparisons_;
  local_58.root_.
  super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*>
        )btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
         ::EmptyNode()::empty_node;
  local_58.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,64,false>>
       ::EmptyNode()::empty_node;
  local_58.size_ = 0;
  local_70.root_.
  super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
        )btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
         ::EmptyNode()::empty_node;
  local_70.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
       ::EmptyNode()::empty_node;
  local_70.size_ = 0;
  local_88.root_.
  super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
        )btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
         ::EmptyNode()::empty_node;
  local_88.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
       ::EmptyNode()::empty_node;
  local_88.size_ = 0;
  GenerateValuesWithSeed<int>(&local_a0,10000,0x400000,0x17);
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_b8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_b0,"BtreeNodePeer::GetNumValuesPerNode<decltype(set3)>()","3",
             (unsigned_long *)&local_c0,(int *)&local_b8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x5b3,pcVar8);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d;
  local_b8.data_._0_4_ = 0x3d;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_b0,"BtreeNodePeer::GetNumValuesPerNode<decltype(set61)>()","61",
             (unsigned_long *)&local_c0,(int *)&local_b8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x5b4,pcVar8);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x64;
  local_b8.data_._0_4_ = 100;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_b0,"BtreeNodePeer::GetNumValuesPerNode<decltype(set100)>()","100",
             (unsigned_long *)&local_c0,(int *)&local_b8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x5b5,pcVar8);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_c0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d;
  local_b8.data_ = (AssertHelperData *)&DAT_0000003d;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_b0,"BtreeNodePeer::GetNumValuesPerNode<phmap::btree_set<int32_t>>()",
             "BtreeNodePeer::GetNumValuesPerNode<decltype(set61)>()",(unsigned_long *)&local_c0,
             (unsigned_long *)&local_b8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x5b8,pcVar8);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,3,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0xb0e1,0x1dec0,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_3,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_58);
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,61,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0x5e69e,0x1d408,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_61,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_70);
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,100,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0x8f409,0x1d5ff,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_100,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_88);
  piVar4 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar7 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar5 = (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar7,piVar4);
  }
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,3,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0x680e,0x167e6,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_3,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_58);
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,61,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0x4ef0,0x156cd,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_61,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_70);
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,100,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0x4e9c,0x17947,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_100,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_88);
  piVar7 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
  piVar3 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start < piVar7 &&
      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      piVar6 = piVar3 + 1;
      iVar1 = *piVar3;
      *piVar3 = *piVar7;
      *piVar7 = iVar1;
      piVar7 = piVar7 + -1;
      piVar3 = piVar6;
    } while (piVar6 < piVar7);
  }
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,3,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0xc31f,0x1ab0e,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_3,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_58);
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,61,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0x52b7d,0x1a6eb,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_61,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_70);
  (anonymous_namespace)::
  ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,100,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
            (0x82801,0x1c250,&local_a0,&local_40,
             (SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_100,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
              *)&local_88);
  if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.size_ != 0) {
    btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
    ::internal_clear(&local_88,
                     (node_type *)
                     local_88.root_.
                     super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
                     ._M_head_impl);
  }
  if (local_70.size_ != 0) {
    btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
    ::internal_clear(&local_70,
                     (node_type *)
                     local_70.root_.
                     super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*,_false>
                     ._M_head_impl);
  }
  if (local_58.size_ != 0) {
    btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>
    ::internal_clear(&local_58,
                     (node_type *)
                     local_58.root_.
                     super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*>
                     .
                     super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*>
                     .
                     super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*>
                     .
                     super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_64,_false>_>_*,_false>
                     ._M_head_impl);
  }
  test_internal::InstanceTracker::~InstanceTracker(&local_40);
  return;
}

Assistant:

bool contains(const key_type &key) const {
        return find(key) != end();
    }